

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVIntHelpers.h
# Opt level: O1

void slang::mul(uint64_t *dst,uint64_t *x,uint32_t xlen,uint64_t *y,uint32_t ylen)

{
  ulong uVar1;
  ulong *puVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  uint32_t uVar11;
  uint xlen_00;
  uint ylen_00;
  uint64_t *puVar12;
  uint64_t *puVar13;
  ulong uVar14;
  ulong uVar15;
  uint ylen_01;
  uint64_t uVar16;
  uint uVar17;
  uint32_t xlen_01;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  bool bVar21;
  TempBuffer<unsigned_long,_128UL> t2;
  TempBuffer<unsigned_long,_128UL> t1;
  uint64_t local_c50 [128];
  uint64_t *local_850;
  ulong local_848;
  uint64_t local_840 [128];
  uint64_t *local_440;
  ulong local_438;
  uint64_t local_430 [128];
  
  uVar15 = (ulong)ylen;
  uVar8 = (ulong)xlen;
  if (ylen < 8 || xlen < 8) {
    if (xlen == 0) {
      uVar16 = 0;
    }
    else {
      uVar20 = *y;
      uVar19 = 0;
      uVar16 = 0;
      do {
        auVar9._8_8_ = 0;
        auVar9._0_8_ = uVar16;
        auVar4._8_8_ = 0;
        auVar4._0_8_ = uVar20;
        auVar6._8_8_ = 0;
        auVar6._0_8_ = x[uVar19];
        auVar9 = auVar4 * auVar6 + auVar9;
        uVar16 = auVar9._8_8_;
        dst[uVar19] = auVar9._0_8_;
        uVar19 = uVar19 + 1;
      } while (uVar8 != uVar19);
    }
    dst[uVar8] = uVar16;
    if (1 < ylen) {
      uVar20 = 1;
      do {
        if (xlen == 0) {
          uVar16 = 0;
        }
        else {
          uVar19 = 0;
          uVar16 = 0;
          do {
            auVar10._8_8_ = 0;
            auVar10._0_8_ = uVar16;
            auVar5._8_8_ = 0;
            auVar5._0_8_ = y[uVar20];
            auVar7._8_8_ = 0;
            auVar7._0_8_ = x[uVar19];
            auVar10 = auVar5 * auVar7 + auVar10;
            uVar14 = auVar10._0_8_;
            puVar2 = dst + (uint)((int)uVar20 + (int)uVar19);
            uVar1 = *puVar2;
            *puVar2 = *puVar2 + uVar14;
            uVar16 = auVar10._8_8_ + (ulong)CARRY8(uVar1,uVar14);
            uVar19 = uVar19 + 1;
          } while (uVar8 != uVar19);
        }
        dst[(int)uVar20 + xlen] = uVar16;
        uVar20 = uVar20 + 1;
      } while (uVar20 != uVar15);
    }
  }
  else {
    puVar13 = y;
    uVar11 = xlen;
    if (ylen < xlen) {
      puVar13 = x;
      uVar15 = uVar8;
      x = y;
      uVar11 = ylen;
    }
    uVar8 = uVar15 >> 1;
    ylen_01 = (uint)uVar8;
    uVar20 = (ulong)uVar11;
    if (ylen_01 < uVar11) {
      uVar20 = uVar8;
    }
    xlen_01 = (uint32_t)uVar20;
    xlen_00 = uVar11 - xlen_01;
    ylen_00 = (uint)uVar15 - ylen_01;
    uVar17 = ylen + xlen;
    uVar19 = (ulong)uVar17;
    local_848 = uVar19;
    if (uVar17 < 0x81) {
      puVar12 = local_840;
    }
    else {
      puVar12 = (uint64_t *)operator_new__(uVar19 * 8);
    }
    uVar1 = uVar19 * 8;
    local_850 = puVar12;
    memset(puVar12,0,uVar1);
    mul(puVar12,x + uVar20,xlen_00,puVar13 + uVar8,ylen_00);
    memset(dst,0,uVar1);
    memcpy(dst + ((uint)uVar15 & 0xfffffffe),local_850,(ulong)(ylen_00 + xlen_00) << 3);
    if (uVar17 < 0x81) {
      puVar12 = local_c50;
    }
    else {
      puVar12 = (uint64_t *)operator_new__(uVar1);
    }
    memset(puVar12,0,uVar1);
    mul(puVar12,x,xlen_01,puVar13,ylen_01);
    memcpy(dst,puVar12,(ulong)(xlen_01 + ylen_01) << 3);
    uVar18 = uVar17 - ylen_01;
    if (uVar18 != 0) {
      uVar15 = 0;
      bVar21 = false;
      do {
        puVar2 = dst + uVar8 + uVar15;
        uVar14 = (ulong)bVar21;
        uVar3 = *puVar2 - puVar12[uVar15];
        bVar21 = *puVar2 < puVar12[uVar15] || uVar3 < uVar14;
        *puVar2 = uVar3 - uVar14;
        uVar15 = uVar15 + 1;
      } while (uVar18 != uVar15);
    }
    if (uVar17 != ylen_01) {
      uVar15 = 0;
      bVar21 = false;
      do {
        puVar2 = dst + uVar8 + uVar15;
        uVar14 = (ulong)bVar21;
        uVar3 = *puVar2 - local_850[uVar15];
        bVar21 = *puVar2 < local_850[uVar15] || uVar3 < uVar14;
        *puVar2 = uVar3 - uVar14;
        uVar15 = uVar15 + 1;
      } while (uVar18 != uVar15);
    }
    memset(local_850,0,local_848 << 3);
    unevenAdd(local_850,x + uVar20,xlen_00,x,xlen_01);
    memset(puVar12,0,uVar19 << 3);
    unevenAdd(puVar12,puVar13 + uVar8,ylen_00,puVar13,ylen_01);
    if (xlen_00 < xlen_01) {
      xlen_00 = xlen_01;
    }
    if (ylen_00 < ylen_01) {
      ylen_00 = ylen_01;
    }
    if (uVar17 <= xlen_00 + ylen_00 + 2) {
      assert::assertFailed
                ("std::max(xlSize, xhSize) + 1 + std::max(ylSize, yhSize) + 1 < xlen + ylen",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/numeric/SVIntHelpers.h"
                 ,0x174,
                 "void slang::mulKaratsuba(uint64_t *, const uint64_t *, uint32_t, const uint64_t *, uint32_t)"
                );
    }
    local_438 = uVar19;
    if (uVar17 < 0x81) {
      puVar13 = local_430;
    }
    else {
      puVar13 = (uint64_t *)operator_new__(uVar1);
    }
    local_440 = puVar13;
    memset(puVar13,0,uVar1);
    mul(puVar13,local_850,xlen_00 + 1,puVar12,ylen_00 + 1);
    if (uVar17 != ylen_01) {
      uVar15 = 0;
      bVar21 = false;
      do {
        puVar2 = dst + uVar8 + uVar15;
        uVar20 = (ulong)bVar21;
        uVar1 = *puVar2 + local_440[uVar15];
        bVar21 = CARRY8(*puVar2,local_440[uVar15]) || CARRY8(uVar1,uVar20);
        *puVar2 = uVar1 + uVar20;
        uVar15 = uVar15 + 1;
      } while (uVar18 != uVar15);
    }
    if (local_440 != (uint64_t *)0x0 && 0x80 < local_438) {
      operator_delete__(local_440);
    }
    if ((0x80 < uVar19) && (puVar12 != (uint64_t *)0x0)) {
      operator_delete__(puVar12);
    }
    if ((0x80 < local_848) && (local_850 != (uint64_t *)0x0)) {
      operator_delete__(local_850);
    }
  }
  return;
}

Assistant:

static void mul(uint64_t* dst, const uint64_t* x, uint32_t xlen, const uint64_t* y, uint32_t ylen) {
    if (xlen > 7 && ylen > 7) {
        mulKaratsuba(dst, x, xlen, y, ylen);
        return;
    }

    dst[xlen] = mulOne(dst, x, xlen, y[0]);
    for (uint32_t i = 1; i < ylen; i++) {
        uint64_t carry = 0;
        for (uint32_t j = 0; j < xlen; j++) {
            calc_out_t result;
            uint8_t c = addcarry64(0, mulTerm(x[j], y[i], carry), dst[i + j], &result);

            dst[i + j] = result;
            carry += c;
        }
        dst[i + xlen] = carry;
    }
}